

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

Rational128 * __thiscall
btConvexHullInternal::Vertex::dot(Rational128 *__return_storage_ptr__,Vertex *this,Point64 *b)

{
  long lVar1;
  uint64_t uVar2;
  long lVar3;
  ulong uVar4;
  Int128 IVar5;
  Int128 IVar6;
  ulong local_50;
  uint64_t local_48;
  Int128 local_40;
  
  if ((this->point).index < 0) {
    IVar5 = Int128::operator*(&(this->point128).x,b->x);
    IVar6 = Int128::operator*(&(this->point128).y,b->y);
    local_50 = IVar5.low;
    uVar4 = IVar6.low + local_50;
    local_48 = IVar5.high;
    IVar5 = Int128::operator*(&(this->point128).z,b->z);
    local_40.low = IVar5.low + uVar4;
    local_40.high =
         IVar5.high + IVar6.high + local_48 + (ulong)CARRY8(IVar6.low,local_50) +
         (ulong)CARRY8(IVar5.low,uVar4);
    Rational128::Rational128(__return_storage_ptr__,&local_40,&(this->point128).denominator);
    return __return_storage_ptr__;
  }
  lVar3 = (long)(this->point).y * b->y + (long)(this->point).x * b->x;
  lVar1 = (long)(this->point).z * b->z;
  uVar2 = lVar1 + lVar3;
  if (uVar2 == 0 || SCARRY8(lVar1,lVar3) != (long)uVar2 < 0) {
    if ((long)uVar2 >= 0) {
      __return_storage_ptr__->sign = 0;
      (__return_storage_ptr__->numerator).low = 0;
      (__return_storage_ptr__->numerator).high = 0;
      goto LAB_0012e0dd;
    }
    __return_storage_ptr__->sign = -1;
    uVar2 = -uVar2;
  }
  else {
    __return_storage_ptr__->sign = 1;
  }
  (__return_storage_ptr__->numerator).low = uVar2;
  (__return_storage_ptr__->numerator).high = 0;
LAB_0012e0dd:
  (__return_storage_ptr__->denominator).low = 1;
  (__return_storage_ptr__->denominator).high = 0;
  __return_storage_ptr__->isInt64 = true;
  return __return_storage_ptr__;
}

Assistant:

Rational128 dot(const Point64& b) const
				{
					return (point.index >= 0) ? Rational128(point.dot(b))
						: Rational128(point128.x * b.x + point128.y * b.y + point128.z * b.z, point128.denominator);
				}